

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeMassMatrix(ChElementShellANCF_3423 *this)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  double rho;
  ShellANCF_Mass myformula;
  ChMatrixNM<double,_24,_24> TempMassMatrix;
  double local_1298;
  ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> local_1290;
  ChElementShellANCF_3423 *local_1288;
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_1280 [293];
  
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&this->m_MassMatrix);
  lVar4 = 8;
  for (uVar3 = 0; uVar3 < this->m_numLayers; uVar3 = uVar3 + 1) {
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_1280,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_T0).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage +
               lVar4 + -0x40));
    dVar1 = (local_1280[0]._M_ptr)->m_rho;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1280[0]._M_refcount);
    local_1290._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_01183600;
    local_1298 = dVar1;
    local_1288 = this;
    Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1280);
    pdVar2 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
              ((Matrix<double,_24,_24,_1,_24,_24> *)local_1280,&local_1290,-1.0,1.0,-1.0,1.0,
               pdVar2[uVar3],pdVar2[uVar3 + 1],2);
    Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1280,&local_1298);
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)&this->m_MassMatrix,
               (MatrixBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1280);
    lVar4 = lVar4 + 0x160;
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeMassMatrix() {
    m_MassMatrix.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        ShellANCF_Mass myformula(this);
        ChMatrixNM<double, 24, 24> TempMassMatrix;
        TempMassMatrix.setZero();
        ChQuadrature::Integrate3D<ChMatrixNM<double, 24, 24>>(TempMassMatrix,  // result of integration will go there
                                                              myformula,       // formula to integrate
                                                              -1, 1,           // x limits
                                                              -1, 1,           // y limits
                                                              m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                              2                                // order of integration
        );
        TempMassMatrix *= rho;
        m_MassMatrix += TempMassMatrix;
    }
}